

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkSampler_T ** __thiscall
Fossilize::StateRecorder::Impl::copy<VkSampler_T*>
          (Impl *this,VkSampler_T **src,size_t count,ScratchAllocator *alloc)

{
  VkSampler_T **new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkSampler_T **src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkSampler_T*>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkSampler_T*const*,VkSampler_T**>(src,src + count,(VkSampler_T **)this_local);
    }
  }
  return (VkSampler_T **)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}